

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizer-a2.cpp
# Opt level: O1

void __thiscall
RasterizerA2::_renderImpl<CompositorScalar,false>(RasterizerA2 *this,uint32_t argb32)

{
  uint uVar1;
  uint uVar2;
  Image *pIVar3;
  long lVar4;
  Bounds *pBVar5;
  size_t sVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  uint32_t *dstPix;
  uint8_t *puVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  int32_t *piVar15;
  ulong uVar16;
  uint uVar17;
  
  uVar12 = (this->_yBounds).start;
  uVar7 = (ulong)(int)uVar12;
  uVar1 = (this->_yBounds).end;
  if (uVar12 <= uVar1) {
    pIVar3 = (this->super_CellRasterizer).super_Rasterizer._dst;
    lVar4 = pIVar3->_stride;
    iVar11 = (argb32 & 0xff00ff) * (argb32 >> 0x18);
    iVar9 = (argb32 >> 8 & 0xff | 0xff0000) * (argb32 >> 0x18);
    uVar17 = (iVar9 + 0x800080U >> 8 & 0xff00ff) + iVar9 + 0x800080;
    uVar12 = iVar11 + (iVar11 + 0x800080U >> 8 & 0xff00ff) + 0x800080 >> 8 & 0xff00ff;
    puVar10 = pIVar3->_data + lVar4 * uVar7;
    pBVar5 = this->_xBounds;
    sVar6 = this->_cellStride;
    piVar15 = &this->_cells[sVar6 * uVar7].area;
    do {
      if (pBVar5[uVar7].end != 0) {
        uVar8 = pBVar5[uVar7].end + 1;
        uVar2 = (this->super_CellRasterizer).super_Rasterizer._width;
        if ((int)uVar2 < (int)uVar8) {
          uVar8 = uVar2;
        }
        uVar2 = pBVar5[uVar7].start;
        uVar16 = (ulong)(int)uVar2;
        pBVar5[uVar7].start = 0x7fffffff;
        pBVar5[uVar7].end = 0;
        if (uVar2 < uVar8) {
          iVar9 = 0;
          do {
            iVar9 = iVar9 + piVar15[uVar16 * 2 + -1];
            uVar14 = iVar9 - ((uint)piVar15[uVar16 * 2] >> 9) & 0x1ff;
            uVar2 = uVar14 ^ 0x1ff;
            if (uVar14 < 0x100) {
              uVar2 = uVar14;
            }
            *(undefined8 *)(piVar15 + uVar16 * 2 + -1) = 0;
            uVar14 = uVar17 & 0xff00ff00 | uVar12;
            if (uVar2 != 0xff) {
              iVar13 = uVar2 * uVar12 +
                       (*(uint *)(puVar10 + uVar16 * 4) & 0xff00ff) * (0xff - uVar2);
              iVar11 = uVar2 * (uVar17 >> 8 & 0xff00ff) +
                       (0xff - uVar2) * (*(uint *)(puVar10 + uVar16 * 4) >> 8 & 0xff00ff);
              uVar14 = (iVar13 + 0x800080U >> 8 & 0xff00ff) + iVar13 + 0x800080 >> 8 & 0xff00ff |
                       iVar11 + (iVar11 + 0x800080U >> 8 & 0xff00ff) + 0x800080 & 0xff00ff00;
            }
            *(uint *)(puVar10 + uVar16 * 4) = uVar14;
            uVar16 = uVar16 + 1;
          } while (uVar16 < (ulong)(long)(int)uVar8);
        }
      }
      uVar7 = uVar7 + 1;
      puVar10 = puVar10 + lVar4;
      piVar15 = piVar15 + sVar6 * 2;
    } while (uVar7 <= (ulong)(long)(int)uVar1);
  }
  (this->_yBounds).start = 0x7fffffff;
  (this->_yBounds).end = 0;
  return;
}

Assistant:

inline void RasterizerA2::_renderImpl(uint32_t argb32) noexcept {
  size_t y0 = size_t(_yBounds.start);
  size_t y1 = size_t(_yBounds.end);

  intptr_t stride = _dst->stride();
  uint8_t* dstLine = _dst->data() + y0 * stride;

  Compositor compositor(argb32);
  while (y0 <= y1) {
    uint32_t* dstPix = reinterpret_cast<uint32_t*>(dstLine);
    Cell* cell = &_cells[y0 * _cellStride];

    if (!_xBounds[y0].empty()) {
      int x0 = _xBounds[y0].start;
      int x1 = std::min(_xBounds[y0].end + 1, _width);
      _xBounds[y0].reset();

      int cover = 0;
      compositor.template vmask<NonZero>(dstPix, size_t(x0), size_t(x1), cell, cover);
    }

    y0++;
    dstLine += stride;
  }

  _yBounds.reset();
}